

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::JsonReporter::testCasePartialStarting
          (JsonReporter *this,TestCaseInfo *param_1,uint64_t index)

{
  _Elt_pointer pJVar1;
  StringRef key;
  uint64_t local_1b0;
  undefined1 local_1a8 [408];
  
  local_1b0 = index;
  startObject(this);
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1a8,(int)pJVar1 + -0x18,"run-idx",7);
  JsonValueWriter::writeImpl<unsigned_long,void>((JsonValueWriter *)local_1a8,&local_1b0,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x88));
  key.m_size = 4;
  key.m_start = "path";
  startArray(this,key);
  return;
}

Assistant:

void JsonReporter::testCasePartialStarting( TestCaseInfo const& /*tcInfo*/,
                                                uint64_t index ) {
        startObject();
        m_objectWriters.top().write( "run-idx"_sr ).write( index );
        startArray( "path"_sr );
        // TODO: we want to delay most of the printing to the 'root' section
        // TODO: childSection key name?
    }